

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NativeEnumerated.c
# Opt level: O3

asn_enc_rval_t *
NativeEnumerated_encode_uper
          (asn_enc_rval_t *__return_storage_ptr__,asn_TYPE_descriptor_t *td,
          asn_per_constraints_t *constraints,void *sptr,asn_per_outp_t *po)

{
  long *plVar1;
  bool bVar2;
  int iVar3;
  void *pvVar4;
  long lVar5;
  long lVar6;
  asn_INTEGER_enum_map_t key;
  long local_48 [3];
  
  if (sptr == (void *)0x0) {
    __return_storage_ptr__->encoded = -1;
    __return_storage_ptr__->failed_type = td;
LAB_001412ea:
    __return_storage_ptr__->structure_ptr = (void *)0x0;
  }
  else {
    plVar1 = (long *)td->specifics;
    if (((plVar1 != (long *)0x0) &&
        (((constraints != (asn_per_constraints_t *)0x0 ||
          (constraints = td->per_constraints, constraints != (asn_per_constraints_t *)0x0)) &&
         (local_48[0] = *sptr, -1 < local_48[0])))) &&
       (pvVar4 = bsearch(local_48,(void *)*plVar1,(long)(int)plVar1[2],0x18,
                         NativeEnumerated__compar_value2enum), pvVar4 != (void *)0x0)) {
      lVar6 = ((long)pvVar4 - *plVar1 >> 3) * -0x5555555555555555;
      if ((constraints->value).range_bits < 0) {
        if ((((constraints->value).flags & APC_EXTENSIBLE) == APC_UNCONSTRAINED) ||
           (iVar3 = per_put_few_bits(po,0,1), iVar3 == 0)) {
LAB_00141364:
          iVar3 = (constraints->value).range_bits;
          if (iVar3 < 0) {
            bVar2 = true;
LAB_0014137b:
            if (*(int *)((long)plVar1 + 0x14) == 0) goto LAB_0014139d;
            iVar3 = 0;
            if (!bVar2) {
              iVar3 = *(int *)((long)plVar1 + 0x14) + -1;
            }
            iVar3 = uper_put_nsnnwn(po,(uint32_t)lVar6 - iVar3);
          }
          else {
            iVar3 = per_put_few_bits(po,(uint32_t)lVar6,iVar3);
          }
          if (iVar3 == 0) {
            __return_storage_ptr__->encoded = 0;
            __return_storage_ptr__->failed_type = (asn_TYPE_descriptor_s *)0x0;
            goto LAB_001412ea;
          }
        }
      }
      else {
        if (*(int *)((long)plVar1 + 0x14) == 0) {
          iVar3 = (int)plVar1[2];
        }
        else {
          iVar3 = *(int *)((long)plVar1 + 0x14) + -1;
        }
        lVar5 = (long)iVar3;
        if (((constraints->value).flags & APC_EXTENSIBLE) == APC_UNCONSTRAINED) {
          if (lVar6 < lVar5) goto LAB_00141364;
        }
        else {
          iVar3 = per_put_few_bits(po,(uint)(lVar5 <= lVar6),1);
          if (iVar3 == 0) {
            if (lVar6 < lVar5) goto LAB_00141364;
            bVar2 = false;
            goto LAB_0014137b;
          }
        }
      }
    }
LAB_0014139d:
    __return_storage_ptr__->encoded = -1;
    __return_storage_ptr__->failed_type = td;
    __return_storage_ptr__->structure_ptr = sptr;
  }
  return __return_storage_ptr__;
}

Assistant:

asn_enc_rval_t
NativeEnumerated_encode_uper(asn_TYPE_descriptor_t *td,
	asn_per_constraints_t *constraints, void *sptr, asn_per_outp_t *po) {
	asn_INTEGER_specifics_t *specs = (asn_INTEGER_specifics_t *)td->specifics;
	asn_enc_rval_t er;
	long native, value;
	asn_per_constraint_t *ct;
	int inext = 0;
	asn_INTEGER_enum_map_t key;
	const asn_INTEGER_enum_map_t *kf;

	if(!sptr) ASN__ENCODE_FAILED;
	if(!specs) ASN__ENCODE_FAILED;

	if(constraints) ct = &constraints->value;
	else if(td->per_constraints) ct = &td->per_constraints->value;
	else ASN__ENCODE_FAILED;	/* Mandatory! */

	ASN_DEBUG("Encoding %s as NativeEnumerated", td->name);

	er.encoded = 0;

	native = *(long *)sptr;
	if(native < 0) ASN__ENCODE_FAILED;

	key.nat_value = native;
	kf = bsearch(&key, specs->value2enum, specs->map_count,
		sizeof(key), NativeEnumerated__compar_value2enum);
	if(!kf) {
		ASN_DEBUG("No element corresponds to %ld", native);
		ASN__ENCODE_FAILED;
	}
	value = kf - specs->value2enum;

	if(ct->range_bits >= 0) {
		int cmpWith = specs->extension
				? specs->extension - 1 : specs->map_count;
		if(value >= cmpWith)
			inext = 1;
	}
	if(ct->flags & APC_EXTENSIBLE) {
		if(per_put_few_bits(po, inext, 1))
			ASN__ENCODE_FAILED;
		if(inext) ct = 0;
	} else if(inext) {
		ASN__ENCODE_FAILED;
	}

	if(ct && ct->range_bits >= 0) {
		if(per_put_few_bits(po, value, ct->range_bits))
			ASN__ENCODE_FAILED;
		ASN__ENCODED_OK(er);
	}

	if(!specs->extension)
		ASN__ENCODE_FAILED;

	/*
	 * X.691, #10.6: normally small non-negative whole number;
	 */
	ASN_DEBUG("value = %ld, ext = %d, inext = %d, res = %ld",
		value, specs->extension, inext,
		value - (inext ? (specs->extension - 1) : 0));
	if(uper_put_nsnnwn(po, value - (inext ? (specs->extension - 1) : 0)))
		ASN__ENCODE_FAILED;

	ASN__ENCODED_OK(er);
}